

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::interval_t,_duckdb::interval_t,_duckdb::interval_t,_duckdb::LowerInclusiveBetweenOperator,_true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *in_RCX;
  UnifiedVectorFormat *in_RDX;
  SelectionVector *unaff_RBX;
  UnifiedVectorFormat *in_RSI;
  UnifiedVectorFormat *in_RDI;
  idx_t in_R8;
  SelectionVector *in_R9;
  SelectionVector *unaff_R12;
  ValidityMask *unaff_R14;
  ValidityMask *unaff_R15;
  ValidityMask *unaff_retaddr;
  SelectionVector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  undefined8 uStack_28;
  
  if ((in_R9 == (SelectionVector *)0x0) || (in_stack_00000008 == (SelectionVector *)0x0)) {
    if (in_R9 == (SelectionVector *)0x0) {
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDI);
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RSI);
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDX);
      uStack_28 = SelectLoop<duckdb::interval_t,_duckdb::interval_t,_duckdb::interval_t,_duckdb::LowerInclusiveBetweenOperator,_true,_false,_true>
                            ((interval_t *)in_RDI,(interval_t *)in_RSI,(interval_t *)in_RDX,in_RCX,
                             in_R8,in_R9,unaff_RBX,unaff_R12,unaff_R14,unaff_R15,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010);
    }
    else {
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDI);
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RSI);
      UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDX);
      uStack_28 = SelectLoop<duckdb::interval_t,_duckdb::interval_t,_duckdb::interval_t,_duckdb::LowerInclusiveBetweenOperator,_true,_true,_false>
                            ((interval_t *)in_RDI,(interval_t *)in_RSI,(interval_t *)in_RDX,in_RCX,
                             in_R8,in_R9,unaff_RBX,unaff_R12,unaff_R14,unaff_R15,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010);
    }
  }
  else {
    UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDI);
    UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RSI);
    UnifiedVectorFormat::GetData<duckdb::interval_t>(in_RDX);
    uStack_28 = SelectLoop<duckdb::interval_t,_duckdb::interval_t,_duckdb::interval_t,_duckdb::LowerInclusiveBetweenOperator,_true,_true,_true>
                          ((interval_t *)in_RDI,(interval_t *)in_RSI,(interval_t *)in_RDX,in_RCX,
                           in_R8,in_R9,unaff_RBX,unaff_R12,unaff_R14,unaff_R15,unaff_retaddr,
                           in_stack_00000008,in_stack_00000010);
  }
  return uStack_28;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}